

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_ARB1_TEXLD(Context *ctx)

{
  int iVar1;
  Context *ctx_local;
  
  iVar1 = shader_version_atleast(ctx,'\x01','\x04');
  if (iVar1 == 0) {
    arb1_texld(ctx,"TEX",0);
  }
  else {
    iVar1 = shader_version_atleast(ctx,'\x02','\0');
    if (iVar1 == 0) {
      fail(ctx,"TEXLD == Shader Model 1.4 unimplemented.");
    }
    else if (ctx->instruction_controls == 0) {
      arb1_texld(ctx,"TEX",0);
    }
    else if (ctx->instruction_controls == 1) {
      arb1_texld(ctx,"TXP",0);
    }
    else if (ctx->instruction_controls == 2) {
      arb1_texld(ctx,"TXB",0);
    }
  }
  return;
}

Assistant:

EMIT_ARB1_OPCODE_UNIMPLEMENTED_FUNC(TEXCRD)

static void emit_ARB1_TEXLD(Context *ctx)
{
    if (!shader_version_atleast(ctx, 1, 4))
    {
        arb1_texld(ctx, "TEX", 0);
        return;
    } // if

    else if (!shader_version_atleast(ctx, 2, 0))
    {
        // ps_1_4 is different, too!
        fail(ctx, "TEXLD == Shader Model 1.4 unimplemented.");  // !!! FIXME
        return;
    } // if

    // !!! FIXME: do texldb and texldp map between OpenGL and D3D correctly?
    if (ctx->instruction_controls == CONTROL_TEXLD)
        arb1_texld(ctx, "TEX", 0);
    else if (ctx->instruction_controls == CONTROL_TEXLDP)
        arb1_texld(ctx, "TXP", 0);
    else if (ctx->instruction_controls == CONTROL_TEXLDB)
        arb1_texld(ctx, "TXB", 0);
}